

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void nesapu_set_panning(void *chip,INT16 square1,INT16 square2,INT16 triangle,INT16 noise,INT16 dpcm
                       )

{
  nesapu_state *info;
  INT16 dpcm_local;
  INT16 noise_local;
  INT16 triangle_local;
  INT16 square2_local;
  INT16 square1_local;
  void *chip_local;
  
  Panning_Calculate((INT32 *)((long)chip + 0x28),square1);
  Panning_Calculate((INT32 *)((long)chip + 0x50),square2);
  Panning_Calculate((INT32 *)((long)chip + 0x78),triangle);
  Panning_Calculate((INT32 *)((long)chip + 0x98),noise);
  Panning_Calculate((INT32 *)((long)chip + 0xc4),dpcm);
  return;
}

Assistant:

void nesapu_set_panning(void* chip, INT16 square1, INT16 square2, INT16 triangle, INT16 noise, INT16 dpcm)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	Panning_Calculate(info->APU.squ[0].Pan, square1);
	Panning_Calculate(info->APU.squ[1].Pan, square2);
	Panning_Calculate(info->APU.tri.Pan, triangle);
	Panning_Calculate(info->APU.noi.Pan, noise);
	Panning_Calculate(info->APU.dpcm.Pan, dpcm);
	
	return;
}